

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

Vec_Int_t * Gia_SweeperCollectValidProbeIds(Gia_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int local_28;
  int ProbeId;
  int iLit;
  Vec_Int_t *vProbeIds;
  Swp_Man_t *pSwp;
  Gia_Man_t *p_local;
  
  pvVar1 = p->pData;
  p_00 = Vec_IntAlloc(1000);
  for (local_28 = 0; iVar2 = Vec_IntSize(*(Vec_Int_t **)((long)pvVar1 + 0x10)), local_28 < iVar2;
      local_28 = local_28 + 1) {
    iVar2 = Vec_IntEntry(*(Vec_Int_t **)((long)pvVar1 + 0x10),local_28);
    if (-1 < iVar2) {
      Vec_IntPush(p_00,local_28);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_SweeperCollectValidProbeIds( Gia_Man_t * p )
{
    Swp_Man_t * pSwp = (Swp_Man_t *)p->pData;
    Vec_Int_t * vProbeIds = Vec_IntAlloc( 1000 );
    int iLit, ProbeId;
    Vec_IntForEachEntry( pSwp->vProbes, iLit, ProbeId )
    {
        if ( iLit < 0 ) continue;
        Vec_IntPush( vProbeIds, ProbeId );
    }
    return vProbeIds;
}